

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_zlib_decompressv
               (ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0x35;
  if (1 < insize) {
    bVar1 = *in;
    uVar2 = 0x18;
    if ((((uint)CONCAT11(bVar1,in[1]) * -0x42108421 < 0x8421085) &&
        (uVar2 = 0x19, -1 < (char)bVar1 && (bVar1 & 0xf) == 8)) &&
       (uVar2 = 0x1a, (in[1] & 0x20) == 0)) {
      if (settings->custom_inflate ==
          (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0)
      {
        uVar2 = lodepng_inflatev(out,in + 2,insize - 2,settings);
      }
      else {
        uVar2 = (*settings->custom_inflate)(&out->data,&out->size,in + 2,insize - 2,settings);
        out->allocsize = out->size;
        if (uVar2 == 0) {
          uVar2 = 0;
        }
        else if (settings->max_output_size == 0) {
          uVar2 = 0x6e;
        }
        else {
          uVar2 = 0x6e - (settings->max_output_size < out->size);
        }
      }
      if (uVar2 == 0) {
        if (settings->ignore_adler32 == 0) {
          uVar2 = *(uint *)(in + (insize - 4));
          uVar3 = adler32(out->data,(uint)out->size);
          if (uVar3 != (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18)) {
            return 0x3a;
          }
        }
        uVar2 = 0;
      }
    }
  }
  return uVar2;
}

Assistant:

static unsigned lodepng_zlib_decompressv(ucvector* out,
                                         const unsigned char* in, size_t insize,
                                         const LodePNGDecompressSettings* settings) {
  unsigned error = 0;
  unsigned CM, CINFO, FDICT;

  if(insize < 2) return 53; /*error, size of zlib data too small*/
  /*read information from zlib header*/
  if((in[0] * 256 + in[1]) % 31 != 0) {
    /*error: 256 * in[0] + in[1] must be a multiple of 31, the FCHECK value is supposed to be made that way*/
    return 24;
  }

  CM = in[0] & 15;
  CINFO = (in[0] >> 4) & 15;
  /*FCHECK = in[1] & 31;*/ /*FCHECK is already tested above*/
  FDICT = (in[1] >> 5) & 1;
  /*FLEVEL = (in[1] >> 6) & 3;*/ /*FLEVEL is not used here*/

  if(CM != 8 || CINFO > 7) {
    /*error: only compression method 8: inflate with sliding window of 32k is supported by the PNG spec*/
    return 25;
  }
  if(FDICT != 0) {
    /*error: the specification of PNG says about the zlib stream:
      "The additional flags shall not specify a preset dictionary."*/
    return 26;
  }

  error = inflatev(out, in + 2, insize - 2, settings);
  if(error) return error;

  if(!settings->ignore_adler32) {
    unsigned ADLER32 = lodepng_read32bitInt(&in[insize - 4]);
    unsigned checksum = adler32(out->data, (unsigned)(out->size));
    if(checksum != ADLER32) return 58; /*error, adler checksum not correct, data must be corrupted*/
  }

  return 0; /*no error*/
}